

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::quatd>
          (Attribute *this,double t,quatd *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::quatd> local_88;
  undefined1 local_60 [8];
  optional<tinyusdz::value::quatd> v;
  TimeSampleInterpolationType tinterp_local;
  quatd *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (quatd *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x18),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x18));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::quatd>(&local_88,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
                ((optional<tinyusdz::value::quatd> *)local_60,&local_88);
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_88);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::quatd>::value
                           ((optional<tinyusdz::value::quatd> *)local_60);
        (dst->imag)._M_elems[0] = (pvVar2->imag)._M_elems[0];
        (dst->imag)._M_elems[1] = (pvVar2->imag)._M_elems[1];
        (dst->imag)._M_elems[2] = (pvVar2->imag)._M_elems[2];
        dst->real = pvVar2->real;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional
                ((optional<tinyusdz::value::quatd> *)local_60);
      if (bVar1) goto LAB_007bb111;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatd>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::quatd>(this,dst);
    }
  }
LAB_007bb111:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }